

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_backup_step(sqlite3_backup *p,int nPage)

{
  int *piVar1;
  u8 uVar2;
  u32 uVar3;
  u32 uVar4;
  uint uVar5;
  sqlite3_mutex *psVar6;
  Btree *pBVar7;
  Pager *pPVar8;
  Pager *pPager;
  BtShared *pBVar9;
  BtShared *pBVar10;
  Pager *pPVar11;
  sqlite3_file *pFile;
  bool bVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  Pgno iSrcPg;
  long iSize;
  Pgno PVar17;
  long lVar18;
  long lVar19;
  long in_FS_OFFSET;
  bool bVar20;
  DbPage *pSrcPg;
  DbPage *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psVar6 = p->pSrcDb->mutex;
  if (psVar6 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar6);
  }
  pBVar7 = p->pSrc;
  if ((pBVar7->sharable != '\0') &&
     (pBVar7->wantToLock = pBVar7->wantToLock + 1, pBVar7->locked == '\0')) {
    btreeLockCarefully(pBVar7);
  }
  if ((p->pDestDb != (sqlite3 *)0x0) && (psVar6 = p->pDestDb->mutex, psVar6 != (sqlite3_mutex *)0x0)
     ) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar6);
  }
  uVar15 = p->rc;
  if ((6 < uVar15) || ((0x61U >> (uVar15 & 0x1f) & 1) == 0)) goto LAB_00123ac6;
  pBVar7 = p->pSrc;
  if ((p->pDestDb == (sqlite3 *)0x0) || (pBVar7->pBt->inTransaction != '\x02')) {
    uVar13 = 0;
    bVar20 = true;
  }
  else {
    uVar13 = 5;
    bVar20 = false;
  }
  pPVar8 = pBVar7->pBt->pPager;
  pPager = p->pDest->pBt->pPager;
  bVar12 = true;
  if ((bVar20) && ((pBVar7 == (Btree *)0x0 || (uVar13 = 0, pBVar7->inTrans == '\0')))) {
    if (pBVar7->sharable == '\0') {
      bVar12 = false;
      uVar13 = 0;
      if (pBVar7->inTrans != '\0') goto LAB_0012362a;
    }
    bVar12 = false;
    uVar13 = btreeBeginTrans(pBVar7,0,(int *)0x0);
  }
LAB_0012362a:
  if (p->bDestLocked == 0 && uVar13 == 0) {
    uVar13 = 0;
    iVar14 = sqlite3BtreeSetPageSize(p->pDest,p->pSrc->pBt->pageSize,0,0);
    if (iVar14 == 7) {
      uVar13 = 7;
    }
  }
  if (((uVar13 == 0) && (uVar13 = 0, p->bDestLocked == 0)) &&
     (uVar13 = sqlite3BtreeBeginTrans(p->pDest,2,(int *)&p->iDestSchema), uVar13 == 0)) {
    p->bDestLocked = 1;
    uVar13 = 0;
  }
  pBVar9 = p->pSrc->pBt;
  uVar3 = pBVar9->pageSize;
  lVar16 = (long)(int)uVar3;
  pBVar10 = p->pDest->pBt;
  uVar4 = pBVar10->pageSize;
  uVar2 = pBVar10->pPager->journalMode;
  if (uVar13 == 0) {
    uVar13 = 0;
    if (uVar2 != '\x05') {
      bVar20 = false;
      if (pPager->tempFile == '\0') {
        bVar20 = pPager->memVfs == '\0';
      }
      if (bVar20) goto LAB_001236d7;
    }
    if (uVar3 != uVar4) {
      uVar13 = 8;
    }
  }
LAB_001236d7:
  uVar15 = pBVar9->nPage;
  if (nPage != 0) {
    iVar14 = 1;
    do {
      PVar17 = p->iNext;
      if ((uVar15 < PVar17) || (uVar13 != 0)) break;
      if (PVar17 != (uint)sqlite3PendingByte / p->pSrc->pBt->pageSize + 1) {
        local_40 = (DbPage *)&DAT_aaaaaaaaaaaaaaaa;
        uVar13 = (*pPVar8->xGet)(pPVar8,PVar17,&local_40,2);
        if ((uVar13 == 0) &&
           (uVar13 = backupOnePage(p,PVar17,(u8 *)local_40->pData,0), local_40 != (DbPage *)0x0)) {
          sqlite3PagerUnrefNotNull(local_40);
        }
      }
      p->iNext = p->iNext + 1;
      bVar20 = iVar14 < nPage;
      iVar14 = iVar14 + 1;
    } while (bVar20 || nPage < 0);
  }
  if (uVar13 == 0) {
    p->nPagecount = uVar15;
    uVar13 = 0x65;
    p->nRemaining = (uVar15 - p->iNext) + 1;
    if ((p->iNext <= uVar15) && (uVar13 = 0, p->isAttached == 0)) {
      pPVar11 = p->pSrc->pBt->pPager;
      p->pNext = pPVar11->pBackup;
      pPVar11->pBackup = p;
      p->isAttached = 1;
    }
  }
  if (uVar13 == 0x65) {
    uVar13 = 0x65;
    if (uVar15 == 0) {
      pBVar7 = p->pDest;
      if ((pBVar7->sharable != '\0') &&
         (pBVar7->wantToLock = pBVar7->wantToLock + 1, pBVar7->locked == '\0')) {
        btreeLockCarefully(pBVar7);
      }
      pBVar9 = pBVar7->pBt;
      pBVar9->nPage = 0;
      uVar13 = newDatabase(pBVar9);
      uVar15 = 1;
      if (pBVar7->sharable != '\0') {
        piVar1 = &pBVar7->wantToLock;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          unlockBtreeMutex(pBVar7);
        }
      }
    }
    if ((uVar13 == 0x65) || (uVar13 == 0)) {
      uVar13 = sqlite3BtreeUpdateMeta(p->pDest,1,p->iDestSchema + 1);
    }
    if (uVar13 == 0) {
      if (p->pDestDb != (sqlite3 *)0x0) {
        sqlite3ResetAllSchemasOfConnection(p->pDestDb);
      }
      uVar13 = 0;
      if (uVar2 == '\x05') {
        uVar13 = sqlite3BtreeSetVersion(p->pDest,2);
      }
    }
    if (uVar13 == 0) {
      if ((int)uVar3 < (int)uVar4) {
        iVar14 = (int)(uVar15 + (int)uVar4 / (int)uVar3 + -1) / ((int)uVar4 / (int)uVar3);
        PVar17 = iVar14 - (uint)(iVar14 == (uint)sqlite3PendingByte / p->pDest->pBt->pageSize + 1);
        pFile = pPager->fd;
        uVar5 = pPager->dbSize;
        if (uVar5 < PVar17) {
          bVar20 = true;
          uVar13 = 0;
        }
        else {
          do {
            uVar13 = 0;
            if (PVar17 != (uint)sqlite3PendingByte / p->pDest->pBt->pageSize + 1) {
              local_40 = (DbPage *)&DAT_aaaaaaaaaaaaaaaa;
              uVar13 = (*pPager->xGet)(pPager,PVar17,&local_40,0);
              if ((uVar13 == 0) && (uVar13 = sqlite3PagerWrite(local_40), local_40 != (DbPage *)0x0)
                 ) {
                sqlite3PagerUnrefNotNull(local_40);
              }
            }
            bVar20 = uVar13 == 0;
          } while ((bVar20) && (PVar17 = PVar17 + 1, PVar17 <= uVar5));
        }
        iSize = (int)uVar15 * lVar16;
        if (bVar20) {
          uVar13 = sqlite3PagerCommitPhaseOne(pPager,(char *)0x0,1);
        }
        lVar19 = (long)(int)(uVar4 + sqlite3PendingByte);
        if (iSize < (int)(uVar4 + sqlite3PendingByte)) {
          lVar19 = iSize;
        }
        bVar20 = uVar13 == 0;
        if ((bVar20) && (lVar18 = (long)(int)(sqlite3PendingByte + uVar3), lVar18 < lVar19)) {
          do {
            local_40 = (DbPage *)0x0;
            uVar13 = (*pPVar8->xGet)(pPVar8,(int)(lVar18 / lVar16) + 1,&local_40,0);
            if (uVar13 == 0) {
              uVar13 = (*pFile->pMethods->xWrite)(pFile,local_40->pData,uVar3,lVar18);
            }
            if (local_40 != (DbPage *)0x0) {
              sqlite3PagerUnrefNotNull(local_40);
            }
            bVar20 = uVar13 == 0;
          } while ((bVar20) && (lVar18 = lVar18 + lVar16, lVar18 < lVar19));
        }
        if (bVar20) {
          uVar13 = backupTruncateFile(pFile,iSize);
        }
        if (uVar13 == 0) {
          uVar13 = sqlite3PagerSync(pPager,(char *)0x0);
        }
      }
      else {
        pPager->dbSize = ((int)uVar3 / (int)uVar4) * uVar15;
        uVar13 = sqlite3PagerCommitPhaseOne(pPager,(char *)0x0,0);
      }
      if (uVar13 == 0) {
        uVar15 = sqlite3BtreeCommitPhaseTwo(p->pDest,0);
        uVar13 = 0x65;
        if (uVar15 != 0) {
          uVar13 = uVar15;
        }
      }
    }
  }
  if (!bVar12) {
    sqlite3BtreeCommitPhaseOne(p->pSrc,(char *)0x0);
    sqlite3BtreeCommitPhaseTwo(p->pSrc,0);
  }
  uVar15 = 7;
  if (uVar13 != 0xc0a) {
    uVar15 = uVar13;
  }
  p->rc = uVar15;
LAB_00123ac6:
  if ((p->pDestDb != (sqlite3 *)0x0) && (psVar6 = p->pDestDb->mutex, psVar6 != (sqlite3_mutex *)0x0)
     ) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar6);
  }
  pBVar7 = p->pSrc;
  if (pBVar7->sharable != '\0') {
    piVar1 = &pBVar7->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(pBVar7);
    }
  }
  psVar6 = p->pSrcDb->mutex;
  if (psVar6 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar15;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_API int sqlite3_backup_step(sqlite3_backup *p, int nPage){
  int rc;
  int destMode;       /* Destination journal mode */
  int pgszSrc = 0;    /* Source page size */
  int pgszDest = 0;   /* Destination page size */

#ifdef SQLITE_ENABLE_API_ARMOR
  if( p==0 ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(p->pSrcDb->mutex);
  sqlite3BtreeEnter(p->pSrc);
  if( p->pDestDb ){
    sqlite3_mutex_enter(p->pDestDb->mutex);
  }

  rc = p->rc;
  if( !isFatalError(rc) ){
    Pager * const pSrcPager = sqlite3BtreePager(p->pSrc);     /* Source pager */
    Pager * const pDestPager = sqlite3BtreePager(p->pDest);   /* Dest pager */
    int ii;                            /* Iterator variable */
    int nSrcPage = -1;                 /* Size of source db in pages */
    int bCloseTrans = 0;               /* True if src db requires unlocking */

    /* If the source pager is currently in a write-transaction, return
    ** SQLITE_BUSY immediately.
    */
    if( p->pDestDb && p->pSrc->pBt->inTransaction==TRANS_WRITE ){
      rc = SQLITE_BUSY;
    }else{
      rc = SQLITE_OK;
    }

    /* If there is no open read-transaction on the source database, open
    ** one now. If a transaction is opened here, then it will be closed
    ** before this function exits.
    */
    if( rc==SQLITE_OK && SQLITE_TXN_NONE==sqlite3BtreeTxnState(p->pSrc) ){
      rc = sqlite3BtreeBeginTrans(p->pSrc, 0, 0);
      bCloseTrans = 1;
    }

    /* If the destination database has not yet been locked (i.e. if this
    ** is the first call to backup_step() for the current backup operation),
    ** try to set its page size to the same as the source database. This
    ** is especially important on ZipVFS systems, as in that case it is
    ** not possible to create a database file that uses one page size by
    ** writing to it with another.  */
    if( p->bDestLocked==0 && rc==SQLITE_OK && setDestPgsz(p)==SQLITE_NOMEM ){
      rc = SQLITE_NOMEM;
    }

    /* Lock the destination database, if it is not locked already. */
    if( SQLITE_OK==rc && p->bDestLocked==0
     && SQLITE_OK==(rc = sqlite3BtreeBeginTrans(p->pDest, 2,
                                                (int*)&p->iDestSchema))
    ){
      p->bDestLocked = 1;
    }

    /* Do not allow backup if the destination database is in WAL mode
    ** and the page sizes are different between source and destination */
    pgszSrc = sqlite3BtreeGetPageSize(p->pSrc);
    pgszDest = sqlite3BtreeGetPageSize(p->pDest);
    destMode = sqlite3PagerGetJournalMode(sqlite3BtreePager(p->pDest));
    if( SQLITE_OK==rc
     && (destMode==PAGER_JOURNALMODE_WAL || sqlite3PagerIsMemdb(pDestPager))
     && pgszSrc!=pgszDest
    ){
      rc = SQLITE_READONLY;
    }

    /* Now that there is a read-lock on the source database, query the
    ** source pager for the number of pages in the database.
    */
    nSrcPage = (int)sqlite3BtreeLastPage(p->pSrc);
    assert( nSrcPage>=0 );
    for(ii=0; (nPage<0 || ii<nPage) && p->iNext<=(Pgno)nSrcPage && !rc; ii++){
      const Pgno iSrcPg = p->iNext;                 /* Source page number */
      if( iSrcPg!=PENDING_BYTE_PAGE(p->pSrc->pBt) ){
        DbPage *pSrcPg;                             /* Source page object */
        rc = sqlite3PagerGet(pSrcPager, iSrcPg, &pSrcPg,PAGER_GET_READONLY);
        if( rc==SQLITE_OK ){
          rc = backupOnePage(p, iSrcPg, sqlite3PagerGetData(pSrcPg), 0);
          sqlite3PagerUnref(pSrcPg);
        }
      }
      p->iNext++;
    }
    if( rc==SQLITE_OK ){
      p->nPagecount = nSrcPage;
      p->nRemaining = nSrcPage+1-p->iNext;
      if( p->iNext>(Pgno)nSrcPage ){
        rc = SQLITE_DONE;
      }else if( !p->isAttached ){
        attachBackupObject(p);
      }
    }

    /* Update the schema version field in the destination database. This
    ** is to make sure that the schema-version really does change in
    ** the case where the source and destination databases have the
    ** same schema version.
    */
    if( rc==SQLITE_DONE ){
      if( nSrcPage==0 ){
        rc = sqlite3BtreeNewDb(p->pDest);
        nSrcPage = 1;
      }
      if( rc==SQLITE_OK || rc==SQLITE_DONE ){
        rc = sqlite3BtreeUpdateMeta(p->pDest,1,p->iDestSchema+1);
      }
      if( rc==SQLITE_OK ){
        if( p->pDestDb ){
          sqlite3ResetAllSchemasOfConnection(p->pDestDb);
        }
        if( destMode==PAGER_JOURNALMODE_WAL ){
          rc = sqlite3BtreeSetVersion(p->pDest, 2);
        }
      }
      if( rc==SQLITE_OK ){
        int nDestTruncate;
        /* Set nDestTruncate to the final number of pages in the destination
        ** database. The complication here is that the destination page
        ** size may be different to the source page size.
        **
        ** If the source page size is smaller than the destination page size,
        ** round up. In this case the call to sqlite3OsTruncate() below will
        ** fix the size of the file. However it is important to call
        ** sqlite3PagerTruncateImage() here so that any pages in the
        ** destination file that lie beyond the nDestTruncate page mark are
        ** journalled by PagerCommitPhaseOne() before they are destroyed
        ** by the file truncation.
        */
        assert( pgszSrc==sqlite3BtreeGetPageSize(p->pSrc) );
        assert( pgszDest==sqlite3BtreeGetPageSize(p->pDest) );
        if( pgszSrc<pgszDest ){
          int ratio = pgszDest/pgszSrc;
          nDestTruncate = (nSrcPage+ratio-1)/ratio;
          if( nDestTruncate==(int)PENDING_BYTE_PAGE(p->pDest->pBt) ){
            nDestTruncate--;
          }
        }else{
          nDestTruncate = nSrcPage * (pgszSrc/pgszDest);
        }
        assert( nDestTruncate>0 );

        if( pgszSrc<pgszDest ){
          /* If the source page-size is smaller than the destination page-size,
          ** two extra things may need to happen:
          **
          **   * The destination may need to be truncated, and
          **
          **   * Data stored on the pages immediately following the
          **     pending-byte page in the source database may need to be
          **     copied into the destination database.
          */
          const i64 iSize = (i64)pgszSrc * (i64)nSrcPage;
          sqlite3_file * const pFile = sqlite3PagerFile(pDestPager);
          Pgno iPg;
          int nDstPage;
          i64 iOff;
          i64 iEnd;

          assert( pFile );
          assert( nDestTruncate==0
              || (i64)nDestTruncate*(i64)pgszDest >= iSize || (
                nDestTruncate==(int)(PENDING_BYTE_PAGE(p->pDest->pBt)-1)
             && iSize>=PENDING_BYTE && iSize<=PENDING_BYTE+pgszDest
          ));

          /* This block ensures that all data required to recreate the original
          ** database has been stored in the journal for pDestPager and the
          ** journal synced to disk. So at this point we may safely modify
          ** the database file in any way, knowing that if a power failure
          ** occurs, the original database will be reconstructed from the
          ** journal file.  */
          sqlite3PagerPagecount(pDestPager, &nDstPage);
          for(iPg=nDestTruncate; rc==SQLITE_OK && iPg<=(Pgno)nDstPage; iPg++){
            if( iPg!=PENDING_BYTE_PAGE(p->pDest->pBt) ){
              DbPage *pPg;
              rc = sqlite3PagerGet(pDestPager, iPg, &pPg, 0);
              if( rc==SQLITE_OK ){
                rc = sqlite3PagerWrite(pPg);
                sqlite3PagerUnref(pPg);
              }
            }
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerCommitPhaseOne(pDestPager, 0, 1);
          }

          /* Write the extra pages and truncate the database file as required */
          iEnd = MIN(PENDING_BYTE + pgszDest, iSize);
          for(
            iOff=PENDING_BYTE+pgszSrc;
            rc==SQLITE_OK && iOff<iEnd;
            iOff+=pgszSrc
          ){
            PgHdr *pSrcPg = 0;
            const Pgno iSrcPg = (Pgno)((iOff/pgszSrc)+1);
            rc = sqlite3PagerGet(pSrcPager, iSrcPg, &pSrcPg, 0);
            if( rc==SQLITE_OK ){
              u8 *zData = sqlite3PagerGetData(pSrcPg);
              rc = sqlite3OsWrite(pFile, zData, pgszSrc, iOff);
            }
            sqlite3PagerUnref(pSrcPg);
          }
          if( rc==SQLITE_OK ){
            rc = backupTruncateFile(pFile, iSize);
          }

          /* Sync the database file to disk. */
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerSync(pDestPager, 0);
          }
        }else{
          sqlite3PagerTruncateImage(pDestPager, nDestTruncate);
          rc = sqlite3PagerCommitPhaseOne(pDestPager, 0, 0);
        }

        /* Finish committing the transaction to the destination database. */
        if( SQLITE_OK==rc
         && SQLITE_OK==(rc = sqlite3BtreeCommitPhaseTwo(p->pDest, 0))
        ){
          rc = SQLITE_DONE;
        }
      }
    }

    /* If bCloseTrans is true, then this function opened a read transaction
    ** on the source database. Close the read transaction here. There is
    ** no need to check the return values of the btree methods here, as
    ** "committing" a read-only transaction cannot fail.
    */
    if( bCloseTrans ){
      TESTONLY( int rc2 );
      TESTONLY( rc2  = ) sqlite3BtreeCommitPhaseOne(p->pSrc, 0);
      TESTONLY( rc2 |= ) sqlite3BtreeCommitPhaseTwo(p->pSrc, 0);
      assert( rc2==SQLITE_OK );
    }

    if( rc==SQLITE_IOERR_NOMEM ){
      rc = SQLITE_NOMEM_BKPT;
    }
    p->rc = rc;
  }
  if( p->pDestDb ){
    sqlite3_mutex_leave(p->pDestDb->mutex);
  }
  sqlite3BtreeLeave(p->pSrc);
  sqlite3_mutex_leave(p->pSrcDb->mutex);
  return rc;
}